

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint LodePNGUnknownChunks_copy(LodePNGInfo *dest,LodePNGInfo *src)

{
  void *pvVar1;
  long in_RSI;
  long in_RDI;
  size_t j;
  uint i;
  ulong local_28;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar2;
  
  LodePNGUnknownChunks_cleanup
            ((LodePNGInfo *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  uVar2 = 0;
  while( true ) {
    if (uVar2 == 3) {
      return 0;
    }
    *(undefined8 *)(in_RDI + 0xd0 + (ulong)uVar2 * 8) =
         *(undefined8 *)(in_RSI + 0xd0 + (ulong)uVar2 * 8);
    pvVar1 = lodepng_malloc(0x5d7c33);
    *(void **)(in_RDI + 0xb8 + (ulong)uVar2 * 8) = pvVar1;
    if ((*(long *)(in_RDI + 0xb8 + (ulong)uVar2 * 8) == 0) &&
       (*(long *)(in_RDI + 0xd0 + (ulong)uVar2 * 8) != 0)) break;
    for (local_28 = 0; local_28 < *(ulong *)(in_RSI + 0xd0 + (ulong)uVar2 * 8);
        local_28 = local_28 + 1) {
      *(undefined1 *)(*(long *)(in_RDI + 0xb8 + (ulong)uVar2 * 8) + local_28) =
           *(undefined1 *)(*(long *)(in_RSI + 0xb8 + (ulong)uVar2 * 8) + local_28);
    }
    uVar2 = uVar2 + 1;
  }
  return 0x53;
}

Assistant:

static unsigned LodePNGUnknownChunks_copy(LodePNGInfo* dest, const LodePNGInfo* src)
{
  unsigned i;

  LodePNGUnknownChunks_cleanup(dest);

  for(i = 0; i != 3; ++i)
  {
    size_t j;
    dest->unknown_chunks_size[i] = src->unknown_chunks_size[i];
    dest->unknown_chunks_data[i] = (unsigned char*)lodepng_malloc(src->unknown_chunks_size[i]);
    if(!dest->unknown_chunks_data[i] && dest->unknown_chunks_size[i]) return 83; /*alloc fail*/
    for(j = 0; j < src->unknown_chunks_size[i]; ++j)
    {
      dest->unknown_chunks_data[i][j] = src->unknown_chunks_data[i][j];
    }
  }

  return 0;
}